

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::CleanupMaterialDataT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this,
          TPZVec<TPZMaterialDataT<double>_> *dataVec)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  int64_t size;
  bool bVar5;
  TPZVec<int> nshape;
  TPZVec<int> local_50;
  
  size = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  TPZVec<int>::TPZVec(&local_50,size);
  lVar3 = 0;
  if (size < 1) {
    size = lVar3;
  }
  lVar4 = 0;
  while (bVar5 = size != 0, size = size + -1, bVar5) {
    lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar3);
    if (lVar1 != 0) {
      plVar2 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0)
      ;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x2a0))
                  (plVar2,(long)(dataVec->fStore->super_TPZMaterialData).super_TPZShapeData.
                                fCornerNodeIds.fExtAlloc + lVar4 + -0x30);
      }
    }
    lVar4 = lVar4 + 0x8230;
    lVar3 = lVar3 + 0x10;
  }
  TPZVec<int>::~TPZVec(&local_50);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CleanupMaterialDataT(TPZVec<TPZMaterialDataT<TVar>> &dataVec)
{

    int64_t nref = this->fElementVec.size();

    TPZVec<int> nshape(nref);
    for (int64_t iref = 0; iref < nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (!msp) {
            continue;
        }
        // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
        msp->CleanupMaterialData(dataVec[iref]);
    }
}